

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::TextFlow::Column::const_iterator::addIndentAndSuffix_abi_cxx11_
          (string *__return_storage_ptr__,const_iterator *this,size_t position,size_t length)

{
  size_t sVar1;
  size_t desired_indent;
  size_t length_local;
  size_t position_local;
  const_iterator *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = indentSize(this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)sVar1);
  std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)this->m_column,position);
  if ((this->m_addHyphen & 1U) != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
        Column::const_iterator::addIndentAndSuffix( size_t position,
                                              size_t length ) const {
            std::string ret;
            const auto desired_indent = indentSize();
            ret.reserve( desired_indent + length + m_addHyphen );
            ret.append( desired_indent, ' ' );
            ret.append( m_column.m_string, position, length );
            if ( m_addHyphen ) {
                ret.push_back( '-' );
            }

            return ret;
        }